

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O0

CScript * ParseScript(string *s)

{
  string_view str;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end_00;
  string_view separators;
  span<const_unsigned_char,_18446744073709551615UL> b;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  string_view str_00;
  string_view str_01;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  string_view hex_str;
  iterator pos;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  compare_three_way_result_t<long,_long> cVar5;
  const_reference pvVar6;
  size_type sVar7;
  runtime_error *this;
  CScript *in_RDI;
  long in_FS_OFFSET;
  optional<long> oVar8;
  string *w;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  CScript *result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  optional<long> num;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  opcodetype in_stack_fffffffffffffd44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  allocator<char> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  undefined6 in_stack_fffffffffffffd70;
  byte in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd78;
  undefined6 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd86;
  undefined1 in_stack_fffffffffffffd87;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd98;
  compare_three_way_result_t<long,_long> in_stack_fffffffffffffd9c;
  compare_three_way_result_t<long,_long> in_stack_fffffffffffffd9d;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  _Storage<long,_true> in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdac;
  undefined1 in_stack_fffffffffffffdad;
  undefined1 uVar9;
  allocator<char> local_139;
  char *local_138;
  char *local_130;
  undefined1 local_109 [40];
  allocator<char> local_e1;
  char *local_e0;
  undefined8 local_d0;
  undefined8 local_c0;
  char *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  _Storage<long,_true> local_78;
  undefined1 local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript((CScript *)in_stack_fffffffffffffd38);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd58,
             (char *)in_stack_fffffffffffffd50);
  str_00._M_len._6_1_ = in_stack_fffffffffffffd86;
  str_00._M_len._0_6_ = in_stack_fffffffffffffd80;
  str_00._M_len._7_1_ = in_stack_fffffffffffffd87;
  str_00._M_str = in_stack_fffffffffffffd88._M_current;
  separators._M_len._6_1_ = in_stack_fffffffffffffd76;
  separators._M_len._0_6_ = in_stack_fffffffffffffd70;
  separators._M_len._7_1_ = in_stack_fffffffffffffd77;
  separators._M_str = in_stack_fffffffffffffd78._M_current;
  util::SplitString_abi_cxx11_(str_00,separators);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  __first._M_current = (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68);
  do {
    bVar3 = __gnu_cxx::
            operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd48,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return in_RDI;
      }
LAB_00166d63:
      __stack_chk_fail();
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffd38);
    bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (in_stack_fffffffffffffd38);
    if (!bVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                (in_stack_fffffffffffffd38);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                (in_stack_fffffffffffffd48);
      uVar4 = std::
              all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char)>
                        (__first,in_stack_fffffffffffffd60,
                         (_func_bool_char *)
                         CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
      uVar9 = true;
      if (!(bool)uVar4) {
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 front(in_stack_fffffffffffffd48);
        in_stack_fffffffffffffdad = false;
        uVar9 = false;
        if (*pvVar6 == '-') {
          sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(in_stack_fffffffffffffd38);
          in_stack_fffffffffffffdad = false;
          uVar9 = false;
          if (1 < sVar7) {
            local_b8 = (char *)std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               begin(in_stack_fffffffffffffd38);
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffd48,
                        CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                      (in_stack_fffffffffffffd48);
            in_stack_fffffffffffffdac =
                 std::
                 all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char)>
                           (__first,in_stack_fffffffffffffd60,
                            (_func_bool_char *)
                            CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            in_stack_fffffffffffffdad = in_stack_fffffffffffffdac;
            uVar9 = in_stack_fffffffffffffdac;
          }
        }
      }
      if ((bool)uVar9 == false) {
        bVar1 = false;
        bVar3 = false;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd60._M_current,(size_type)in_stack_fffffffffffffd58,
                   (size_type)in_stack_fffffffffffffd50);
        in_stack_fffffffffffffd87 =
             std::operator==(in_stack_fffffffffffffd48,
                             (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        bVar2 = false;
        if ((bool)in_stack_fffffffffffffd87) {
          sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(in_stack_fffffffffffffd38);
          bVar2 = false;
          if (2 < sVar7) {
            local_e0 = (char *)std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               begin(in_stack_fffffffffffffd38);
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffd48,
                        CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                      (in_stack_fffffffffffffd48);
            in_stack_fffffffffffffd78._M_current = (char *)&local_e1;
            std::allocator<char>::allocator();
            bVar1 = true;
            __end._M_current._6_1_ = in_stack_fffffffffffffd76;
            __end._M_current._0_6_ = in_stack_fffffffffffffd70;
            __end._M_current._7_1_ = in_stack_fffffffffffffd77;
            std::__cxx11::string::
            string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                      (in_stack_fffffffffffffd58,in_stack_fffffffffffffd78,__end,
                       in_stack_fffffffffffffd50);
            bVar3 = true;
            std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd58);
            str._M_str._0_4_ = (int)__first._M_current;
            str._M_len = (size_t)in_stack_fffffffffffffd60._M_current;
            str._M_str._4_4_ = (int)((ulong)__first._M_current >> 0x20);
            in_stack_fffffffffffffd77 = IsHex(str);
            bVar2 = (bool)in_stack_fffffffffffffd77;
          }
        }
        in_stack_fffffffffffffd76 = bVar2;
        in_stack_fffffffffffffd86 = in_stack_fffffffffffffd76;
        if (bVar3) {
          std::__cxx11::string::~string(in_stack_fffffffffffffd38);
        }
        if (bVar1) {
          std::allocator<char>::~allocator(&local_e1);
        }
        std::__cxx11::string::~string(in_stack_fffffffffffffd38);
        if ((in_stack_fffffffffffffd76 & 1) == 0) {
          sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(in_stack_fffffffffffffd38);
          if (((sVar7 < 2) ||
              (pvVar6 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                                  (in_stack_fffffffffffffd48), *pvVar6 != '\'')) ||
             (pvVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                                 (in_stack_fffffffffffffd48), *pvVar6 != '\'')) {
            in_stack_fffffffffffffd44 =
                 anon_unknown.dwarf_934f8::ParseOpCode(in_stack_fffffffffffffd48);
            CScript::operator<<((CScript *)
                                CONCAT17(in_stack_fffffffffffffd77,
                                         CONCAT16(in_stack_fffffffffffffd76,
                                                  in_stack_fffffffffffffd70)),
                                (opcodetype)((ulong)__first._M_current >> 0x20));
          }
          else {
            local_130 = (char *)std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                begin(in_stack_fffffffffffffd38);
            in_stack_fffffffffffffd48 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x1,CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            local_138 = (char *)std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                end(in_stack_fffffffffffffd48);
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator-((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffd48,
                        CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            in_stack_fffffffffffffd50 = &local_139;
            std::allocator<unsigned_char>::allocator
                      ((allocator<unsigned_char> *)in_stack_fffffffffffffd38);
            __last._M_current._6_1_ = in_stack_fffffffffffffd86;
            __last._M_current._0_6_ = in_stack_fffffffffffffd80;
            __last._M_current._7_1_ = in_stack_fffffffffffffd87;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__first._M_current,
                       in_stack_fffffffffffffd88,__last,
                       (allocator_type *)in_stack_fffffffffffffd60._M_current);
            std::allocator<unsigned_char>::~allocator
                      ((allocator<unsigned_char> *)in_stack_fffffffffffffd38);
            std::span<const_unsigned_char,_18446744073709551615UL>::
            span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                      ((span<const_unsigned_char,_18446744073709551615UL> *)
                       in_stack_fffffffffffffd48,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            b._M_ptr._6_1_ = in_stack_fffffffffffffd76;
            b._M_ptr._0_6_ = in_stack_fffffffffffffd70;
            b._M_ptr._7_1_ = in_stack_fffffffffffffd77;
            b._M_extent._M_extent_value = (size_t)in_stack_fffffffffffffd78._M_current;
            CScript::operator<<((CScript *)in_stack_fffffffffffffd58,b);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffd48);
          }
        }
        else {
          local_109._1_8_ =
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin(in_stack_fffffffffffffd38);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffd48,
                      CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                    (in_stack_fffffffffffffd48);
          __first._M_current = local_109;
          std::allocator<char>::allocator();
          __end_00._M_current._6_1_ = in_stack_fffffffffffffd76;
          __end_00._M_current._0_6_ = in_stack_fffffffffffffd70;
          __end_00._M_current._7_1_ = in_stack_fffffffffffffd77;
          std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    (in_stack_fffffffffffffd58,in_stack_fffffffffffffd78,__end_00,
                     in_stack_fffffffffffffd50);
          std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd58);
          hex_str._M_str._0_4_ = in_stack_fffffffffffffda8;
          hex_str._M_len = in_stack_fffffffffffffda0._M_value;
          hex_str._M_str._4_1_ = in_stack_fffffffffffffdac;
          hex_str._M_str._5_1_ = in_stack_fffffffffffffdad;
          hex_str._M_str._6_1_ = uVar9;
          hex_str._M_str._7_1_ = uVar4;
          ParseHex<unsigned_char>(hex_str);
          std::__cxx11::string::~string(in_stack_fffffffffffffd38);
          std::allocator<char>::~allocator((allocator<char> *)local_109);
          in_stack_fffffffffffffd60._M_current =
               (char *)prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                                 ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                  CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          in_stack_fffffffffffffd58 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_109 + 9);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          pos.ptr._4_1_ = in_stack_fffffffffffffdac;
          pos.ptr._0_4_ = in_stack_fffffffffffffda8;
          pos.ptr._5_1_ = in_stack_fffffffffffffdad;
          pos.ptr._6_1_ = uVar9;
          pos.ptr._7_1_ = uVar4;
          last._M_current._4_1_ = in_stack_fffffffffffffd9c._M_value;
          last._M_current._0_4_ = in_stack_fffffffffffffd98;
          last._M_current._5_1_ = in_stack_fffffffffffffd9d._M_value;
          last._M_current._6_1_ = in_stack_fffffffffffffd9e;
          last._M_current._7_1_ = in_stack_fffffffffffffd9f;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::
          insert<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     in_stack_fffffffffffffd78._M_current,pos,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )in_stack_fffffffffffffda0,last);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffd48);
        }
      }
      else {
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd58);
        str_01._M_len._6_1_ = in_stack_fffffffffffffd86;
        str_01._M_len._0_6_ = in_stack_fffffffffffffd80;
        str_01._M_len._7_1_ = in_stack_fffffffffffffd87;
        str_01._M_str = in_stack_fffffffffffffd88._M_current;
        oVar8 = ToIntegral<long>(str_01);
        in_stack_fffffffffffffda0._M_value =
             oVar8.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        in_stack_fffffffffffffd9f =
             oVar8.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
        local_78._M_value = in_stack_fffffffffffffda0._M_value;
        local_70 = in_stack_fffffffffffffd9f;
        bVar3 = std::optional<long>::has_value((optional<long> *)in_stack_fffffffffffffd38);
        in_stack_fffffffffffffd9e = true;
        if (bVar3) {
          local_c0 = 0xffffffff;
          cVar5 = std::operator<=><long,_long>
                            ((optional<long> *)in_stack_fffffffffffffd60._M_current,
                             (long *)in_stack_fffffffffffffd58);
          in_stack_fffffffffffffd9d = cVar5;
          std::__cmp_cat::__unspec::__unspec
                    ((__unspec *)in_stack_fffffffffffffd38,(__unspec *)0x1665c6);
          bVar3 = std::operator>(cVar5._M_value);
          in_stack_fffffffffffffd9e = true;
          if (!bVar3) {
            local_d0 = 0xffffffff00000001;
            cVar5 = std::operator<=><long,_long>
                              ((optional<long> *)in_stack_fffffffffffffd60._M_current,
                               (long *)in_stack_fffffffffffffd58);
            in_stack_fffffffffffffd9c = cVar5;
            std::__cmp_cat::__unspec::__unspec
                      ((__unspec *)in_stack_fffffffffffffd38,(__unspec *)0x166629);
            in_stack_fffffffffffffd9e = std::operator<(cVar5._M_value);
          }
        }
        if ((bool)in_stack_fffffffffffffd9e != false) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this,
                     "script parse error: decimal numeric value only allowed in the range -0xFFFFFFFF...0xFFFFFFFF"
                    );
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00166d63;
        }
        in_stack_fffffffffffffd88._M_current =
             (char *)std::optional<long>::value((optional<long> *)in_stack_fffffffffffffd48);
        CScript::operator<<((CScript *)in_stack_fffffffffffffd48,
                            CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffd38);
  } while( true );
}

Assistant:

CScript ParseScript(const std::string& s)
{
    CScript result;

    std::vector<std::string> words = SplitString(s, " \t\n");

    for (const std::string& w : words) {
        if (w.empty()) {
            // Empty string, ignore. (SplitString doesn't combine multiple separators)
        } else if (std::all_of(w.begin(), w.end(), ::IsDigit) ||
                   (w.front() == '-' && w.size() > 1 && std::all_of(w.begin() + 1, w.end(), ::IsDigit)))
        {
            // Number
            const auto num{ToIntegral<int64_t>(w)};

            // limit the range of numbers ParseScript accepts in decimal
            // since numbers outside -0xFFFFFFFF...0xFFFFFFFF are illegal in scripts
            if (!num.has_value() || num > int64_t{0xffffffff} || num < -1 * int64_t{0xffffffff}) {
                throw std::runtime_error("script parse error: decimal numeric value only allowed in the "
                                         "range -0xFFFFFFFF...0xFFFFFFFF");
            }

            result << num.value();
        } else if (w.substr(0, 2) == "0x" && w.size() > 2 && IsHex(std::string(w.begin() + 2, w.end()))) {
            // Raw hex data, inserted NOT pushed onto stack:
            std::vector<unsigned char> raw = ParseHex(std::string(w.begin() + 2, w.end()));
            result.insert(result.end(), raw.begin(), raw.end());
        } else if (w.size() >= 2 && w.front() == '\'' && w.back() == '\'') {
            // Single-quoted string, pushed as data. NOTE: this is poor-man's
            // parsing, spaces/tabs/newlines in single-quoted strings won't work.
            std::vector<unsigned char> value(w.begin() + 1, w.end() - 1);
            result << value;
        } else {
            // opcode, e.g. OP_ADD or ADD:
            result << ParseOpCode(w);
        }
    }

    return result;
}